

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

bool __thiscall QMenuPrivate::mouseEventTaken(QMenuPrivate *this,QMouseEvent *e)

{
  short sVar1;
  short sVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  long lVar6;
  Data *pDVar7;
  long lVar8;
  QMenuScroller *pQVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  QPointF QVar12;
  QRect QVar13;
  QRect QVar14;
  char cVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  undefined4 uVar22;
  QPoint QVar23;
  QStyle *pQVar24;
  QWidget *pQVar25;
  Data *pDVar26;
  long lVar27;
  undefined8 uVar28;
  Representation RVar29;
  uint uVar30;
  QWidget *pQVar31;
  long in_FS_OFFSET;
  bool bVar32;
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 local_108 [16];
  QPointF local_f8;
  QMouseEvent new_e;
  Representation RStack_e4;
  QPoint QStack_e0;
  QPointF local_98;
  QPoint local_80;
  QStyleOption opt;
  
  QStack_e0 = _new_e;
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar31 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  auVar35 = QEventPoint::globalPosition();
  dVar34 = (double)((ulong)auVar35._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar35._0_8_;
  bVar32 = 2147483647.0 < dVar34;
  if (dVar34 <= -2147483648.0) {
    dVar34 = -2147483648.0;
  }
  dVar33 = (double)((ulong)auVar35._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar35._8_8_;
  bVar10 = 2147483647.0 < dVar33;
  if (dVar33 <= -2147483648.0) {
    dVar33 = -2147483648.0;
  }
  RStack_e4.m_i =
       (int)(double)(-(ulong)bVar10 & 0x41dfffffffc00000 | ~-(ulong)bVar10 & (ulong)dVar33);
  _new_e = (int)(double)(-(ulong)bVar32 & 0x41dfffffffc00000 | ~-(ulong)bVar32 & (ulong)dVar34);
  QVar23 = QWidget::mapFromGlobal(pQVar31,(QPoint *)&new_e);
  local_80 = QVar23;
  pQVar24 = QWidget::style(pQVar31);
  opt.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  opt._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  opt.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  opt._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOption::QStyleOption(&opt,0,0);
  QStyleOption::initFrom(&opt,pQVar31);
  iVar16 = (**(code **)(*(long *)pQVar24 + 0xe0))(pQVar24,0x1c,&opt,pQVar31);
  iVar17 = (**(code **)(*(long *)pQVar24 + 0xe0))(pQVar24,0x1d,&opt,pQVar31);
  iVar18 = (**(code **)(*(long *)pQVar24 + 0xe0))(pQVar24,0x1e,&opt,pQVar31);
  if ((this->scroll != (QMenuScroller *)0x0) &&
     (((pDVar7 = (this->activeMenu).wp.d, pDVar7 == (Data *)0x0 || (*(int *)(pDVar7 + 4) == 0)) ||
      ((this->activeMenu).wp.value == (QObject *)0x0)))) {
    if ((-1 < QVar23.xp.m_i.m_i) &&
       (QVar23.xp.m_i.m_i < ((pQVar31->data->crect).x2.m_i - (pQVar31->data->crect).x1.m_i) + 1)) {
      uVar30 = 1;
      do {
        if ((uVar30 & this->scroll->scrollFlags) != 0) {
          RVar29.m_i = local_80.yp.m_i;
          if (uVar30 == 1) {
            pQVar25 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
            pQVar24 = QWidget::style(pQVar25);
            iVar19 = (**(code **)(*(long *)pQVar24 + 0xe0))(pQVar24,0x1b,0,pQVar25);
            if (RVar29.m_i <= (int)(this->super_QWidgetPrivate).topmargin + iVar17 + iVar18 + iVar19
               ) {
LAB_00459122:
              pQVar9 = this->scroll;
              pQVar9->scrollDirection = (quint8)uVar30;
              QBasicTimer::start(&pQVar9->scrollTimer,50000000,1,pQVar31);
              goto LAB_0045921a;
            }
          }
          else {
            iVar19 = (pQVar31->data->crect).y2.m_i;
            pQVar25 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
            iVar21 = (pQVar31->data->crect).y1.m_i;
            pQVar24 = QWidget::style(pQVar25);
            iVar20 = (**(code **)(*(long *)pQVar24 + 0xe0))(pQVar24,0x1b,0,pQVar25);
            if ((iVar19 - ((int)(this->super_QWidgetPrivate).bottommargin + iVar21 + iVar17 + iVar18
                          + iVar20)) + 1 <= RVar29.m_i) goto LAB_00459122;
          }
        }
        bVar32 = uVar30 < 2;
        uVar30 = uVar30 * 2;
      } while (bVar32);
    }
    QBasicTimer::stop();
  }
  if ((this->field_0x421 & 2) != 0) {
    sVar1 = (this->super_QWidgetPrivate).leftmargin;
    RVar29.m_i = iVar17 + iVar18 + (int)(this->super_QWidgetPrivate).topmargin;
    sVar2 = (this->super_QWidgetPrivate).rightmargin;
    iVar17 = (pQVar31->data->crect).x2.m_i;
    iVar19 = (pQVar31->data->crect).x1.m_i;
    pQVar24 = QWidget::style(pQVar31);
    iVar21 = (**(code **)(*(long *)pQVar24 + 0xe0))(pQVar24,0x1f,&opt,pQVar31);
    RStack_e4.m_i = RVar29.m_i;
    _new_e = (int)sVar1 + iVar16 + iVar18;
    QStack_e0.xp.m_i = (iVar17 - (iVar16 + iVar18)) + (-iVar19 - (int)sVar2);
    QStack_e0.yp.m_i = iVar21 + RVar29.m_i + -1;
    if ((this->scroll != (QMenuScroller *)0x0) && ((this->scroll->scrollFlags & 1) != 0)) {
      pQVar25 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
      pQVar24 = QWidget::style(pQVar25);
      iVar16 = (**(code **)(*(long *)pQVar24 + 0xe0))(pQVar24,0x1b,0,pQVar25);
      QVar13 = _new_e;
      RStack_e4.m_i = RStack_e4.m_i + iVar16;
      QVar14 = _new_e;
      QStack_e0.yp.m_i = (int)QVar13.y2.m_i;
      _new_e = QVar14._0_12_;
      QStack_e0.yp.m_i = QStack_e0.yp.m_i + iVar16;
    }
    QWidget::update(pQVar31,(QRect *)&new_e);
    cVar15 = QRect::contains((QPoint *)&new_e,SUB81(&local_80,0));
    if (cVar15 != '\0') {
      auVar35 = QEventPoint::globalPosition();
      dVar34 = (double)((ulong)auVar35._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar35._0_8_;
      bVar32 = 2147483647.0 < dVar34;
      if (dVar34 <= -2147483648.0) {
        dVar34 = -2147483648.0;
      }
      dVar33 = (double)((ulong)auVar35._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
               auVar35._8_8_;
      bVar10 = 2147483647.0 < dVar33;
      if (dVar33 <= -2147483648.0) {
        dVar33 = -2147483648.0;
      }
      local_98.xp._4_4_ =
           (int)(double)(-(ulong)bVar10 & 0x41dfffffffc00000 | ~-(ulong)bVar10 & (ulong)dVar33);
      local_98.xp._0_4_ =
           (int)(double)(-(ulong)bVar32 & 0x41dfffffffc00000 | ~-(ulong)bVar32 & (ulong)dVar34);
      bVar32 = hasMouseMoved(this,(QPoint *)&local_98);
      if (bVar32) {
        setCurrentAction(this,(QAction *)0x0,-1,SelectedFromElsewhere,false);
        this->field_0x421 = this->field_0x421 | 8;
        if (*(short *)(e + 8) == 3) {
          pDVar7 = (this->tornPopup).wp.d;
          if (((pDVar7 == (Data *)0x0) || (*(int *)(pDVar7 + 4) == 0)) ||
             ((this->tornPopup).wp.value == (QObject *)0x0)) {
            pQVar25 = (QWidget *)operator_new(0x28);
            QTornOffMenu::QTornOffMenu((QTornOffMenu *)pQVar25,(QMenu *)pQVar31);
            pDVar26 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)pQVar25);
            pDVar7 = (this->tornPopup).wp.d;
            (this->tornPopup).wp.d = pDVar26;
            (this->tornPopup).wp.value = (QObject *)pQVar25;
            if (pDVar7 != (Data *)0x0) {
              LOCK();
              *(int *)pDVar7 = *(int *)pDVar7 + -1;
              UNLOCK();
              if (*(int *)pDVar7 == 0) {
                operator_delete(pDVar7);
              }
              goto LAB_00458d33;
            }
          }
          else {
LAB_00458d33:
            pQVar25 = (QWidget *)(this->tornPopup).wp.value;
          }
          QWidget::setGeometry(pQVar25,&pQVar31->data->crect);
          QWidget::show((QWidget *)(this->tornPopup).wp.value);
          hideUpToMenuBar(this);
        }
LAB_0045921a:
        bVar32 = true;
        goto LAB_0045921d;
      }
    }
    this->field_0x421 = this->field_0x421 & 0xf7;
  }
  _new_e = QWidget::frameGeometry(pQVar31);
  auVar35 = QEventPoint::globalPosition();
  QVar12 = local_98;
  dVar34 = (double)((ulong)auVar35._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar35._0_8_;
  bVar32 = 2147483647.0 < dVar34;
  if (dVar34 <= -2147483648.0) {
    dVar34 = -2147483648.0;
  }
  dVar33 = (double)((ulong)auVar35._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar35._8_8_;
  bVar10 = 2147483647.0 < dVar33;
  if (dVar33 <= -2147483648.0) {
    dVar33 = -2147483648.0;
  }
  local_98.xp._4_4_ =
       (int)(double)(-(ulong)bVar10 & 0x41dfffffffc00000 | ~-(ulong)bVar10 & (ulong)dVar33);
  local_98.xp._0_4_ =
       (int)(double)(-(ulong)bVar32 & 0x41dfffffffc00000 | ~-(ulong)bVar32 & (ulong)dVar34);
  local_98.yp = QVar12.yp;
  bVar32 = false;
  cVar15 = QRect::contains((QPoint *)&new_e,SUB81(&local_98,0));
  if (cVar15 == '\0') {
    pDVar7 = (this->causedPopup).widget.wp.d;
    if (((pDVar7 != (Data *)0x0) && (*(int *)(pDVar7 + 4) != 0)) &&
       (pQVar31 = (QWidget *)(this->causedPopup).widget.wp.value, pQVar31 != (QWidget *)0x0)) {
      do {
        local_98.yp._0_4_ = 0xffffffff;
        local_98.xp = -NAN;
        local_98.yp._4_4_ = 0xffffffff;
        _new_e = (QRect)QEventPoint::globalPosition();
        local_98 = QWidget::mapFromGlobal(pQVar31,(QPointF *)&new_e);
        lVar27 = QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
        QVar12 = local_f8;
        if (lVar27 == 0) {
          lVar27 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
          QVar12 = local_f8;
          if (lVar27 == 0) break;
          lVar8 = *(long *)(lVar27 + 0x20);
          auVar35._4_4_ = *(int *)(lVar8 + 0x20) - *(int *)(lVar8 + 0x18);
          auVar35._0_4_ = *(int *)(lVar8 + 0x1c) - *(int *)(lVar8 + 0x14);
          dVar34 = (double)((ulong)local_98.xp & 0x8000000000000000 | 0x3fe0000000000000) +
                   local_98.xp;
          bVar32 = 2147483647.0 < dVar34;
          if (dVar34 <= -2147483648.0) {
            dVar34 = -2147483648.0;
          }
          dVar33 = (double)((ulong)local_98.yp & 0x8000000000000000 | 0x3fe0000000000000) +
                   local_98.yp;
          bVar10 = 2147483647.0 < dVar33;
          if (dVar33 <= -2147483648.0) {
            dVar33 = -2147483648.0;
          }
          auVar35._8_8_ = 0;
          _new_e = (QRect)(auVar35 << 0x40);
          local_f8.xp._4_4_ =
               (int)(double)(-(ulong)bVar10 & 0x41dfffffffc00000 | ~-(ulong)bVar10 & (ulong)dVar33);
          local_f8.xp._0_4_ =
               (int)(double)(-(ulong)bVar32 & 0x41dfffffffc00000 | ~-(ulong)bVar32 & (ulong)dVar34);
          local_f8.yp = QVar12.yp;
          cVar15 = QRect::contains((QPoint *)&new_e,SUB81(&local_f8,0));
          lVar8 = *(long *)(*(long *)(lVar27 + 8) + 0x2f8);
          if ((lVar8 == 0) || (*(int *)(lVar8 + 4) == 0)) goto LAB_00458fb8;
          pQVar25 = *(QWidget **)(*(long *)(lVar27 + 8) + 0x300);
          if (cVar15 != '\0') goto LAB_00458fc2;
        }
        else {
          lVar27 = *(long *)(lVar27 + 0x20);
          auVar11._4_4_ = *(int *)(lVar27 + 0x20) - *(int *)(lVar27 + 0x18);
          auVar11._0_4_ = *(int *)(lVar27 + 0x1c) - *(int *)(lVar27 + 0x14);
          dVar34 = (double)((ulong)local_98.xp & 0x8000000000000000 | 0x3fe0000000000000) +
                   local_98.xp;
          bVar32 = 2147483647.0 < dVar34;
          if (dVar34 <= -2147483648.0) {
            dVar34 = -2147483648.0;
          }
          dVar33 = (double)((ulong)local_98.yp & 0x8000000000000000 | 0x3fe0000000000000) +
                   local_98.yp;
          bVar10 = 2147483647.0 < dVar33;
          if (dVar33 <= -2147483648.0) {
            dVar33 = -2147483648.0;
          }
          auVar11._8_8_ = 0;
          _new_e = (QRect)(auVar11 << 0x40);
          local_f8.xp._4_4_ =
               (int)(double)(-(ulong)bVar10 & 0x41dfffffffc00000 | ~-(ulong)bVar10 & (ulong)dVar33);
          local_f8.xp._0_4_ =
               (int)(double)(-(ulong)bVar32 & 0x41dfffffffc00000 | ~-(ulong)bVar32 & (ulong)dVar34);
          local_f8.yp = QVar12.yp;
          cVar15 = QRect::contains((QPoint *)&new_e,SUB81(&local_f8,0));
LAB_00458fb8:
          if (cVar15 == '\0') break;
          pQVar25 = (QWidget *)0x0;
LAB_00458fc2:
          sVar1 = *(short *)(e + 8);
          if ((sVar1 != 3) || (&mouseDown->super_QWidget == pQVar31)) {
            QStack_e0 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
            _new_e = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
            pQVar25 = QWidget::window(pQVar31);
            local_f8 = QWidget::mapTo(pQVar31,pQVar25,&local_98);
            local_108 = QEventPoint::globalPosition();
            uVar3 = *(undefined4 *)(e + 0x20);
            uVar4 = *(undefined4 *)(e + 0x40);
            uVar5 = *(undefined4 *)(e + 0x44);
            uVar22 = QMouseEvent::source();
            uVar28 = QPointerEvent::pointingDevice();
            QMouseEvent::QMouseEvent
                      (&new_e,sVar1,&local_98,&local_f8,local_108,uVar4,uVar5,uVar3,uVar22,uVar28);
            QCoreApplication::sendEvent(&pQVar31->super_QObject,(QEvent *)&new_e);
            QMouseEvent::~QMouseEvent(&new_e);
            goto LAB_0045921a;
          }
        }
        pQVar31 = pQVar25;
      } while (pQVar25 != (QWidget *)0x0);
      QMenuSloppyState::leave(&this->sloppyState);
    }
    bVar32 = false;
  }
LAB_0045921d:
  QStyleOption::~QStyleOption(&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar6) {
    __stack_chk_fail();
  }
  return bVar32;
}

Assistant:

bool QMenuPrivate::mouseEventTaken(QMouseEvent *e)
{
    Q_Q(QMenu);
    QPoint pos = q->mapFromGlobal(e->globalPosition().toPoint());

    QStyle *style = q->style();
    QStyleOption opt(0);
    opt.initFrom(q);
    const int hmargin = style->pixelMetric(QStyle::PM_MenuHMargin, &opt, q);
    const int vmargin = style->pixelMetric(QStyle::PM_MenuVMargin, &opt, q);
    const int fw = style->pixelMetric(QStyle::PM_MenuPanelWidth, &opt, q);

    if (scroll && !activeMenu) { //let the scroller "steal" the event
        bool isScroll = false;
        if (pos.x() >= 0 && pos.x() < q->width()) {
        for (int dir = QMenuScroller::ScrollUp; dir <= QMenuScroller::ScrollDown; dir = dir << 1) {
                if (scroll->scrollFlags & dir) {
                    if (dir == QMenuScroller::ScrollUp)
                        isScroll = (pos.y() <= scrollerHeight() + fw + vmargin + topmargin);
                    else if (dir == QMenuScroller::ScrollDown)
                        isScroll = (pos.y() >= q->height() - scrollerHeight() - fw - vmargin - bottommargin);
                    if (isScroll) {
                        scroll->scrollDirection = dir;
                        break;
                    }
                }
            }
        }
        if (isScroll) {
            scroll->scrollTimer.start(50, q);
            return true;
        } else {
            scroll->scrollTimer.stop();
        }
    }

    if (tearoff) { //let the tear off thingie "steal" the event..
        QRect tearRect(leftmargin + hmargin + fw, topmargin + vmargin + fw, q->width() - fw * 2 - hmargin * 2 -leftmargin - rightmargin,
                       q->style()->pixelMetric(QStyle::PM_MenuTearoffHeight, &opt, q));
        if (scroll && scroll->scrollFlags & QMenuPrivate::QMenuScroller::ScrollUp)
            tearRect.translate(0, scrollerHeight());
        q->update(tearRect);
        if (tearRect.contains(pos) && hasMouseMoved(e->globalPosition().toPoint())) {
            setCurrentAction(nullptr);
            tearoffHighlighted = 1;
            if (e->type() == QEvent::MouseButtonRelease) {
                if (!tornPopup)
                    tornPopup = new QTornOffMenu(q);
                tornPopup->setGeometry(q->geometry());
                tornPopup->show();
                hideUpToMenuBar();
            }
            return true;
        }
        tearoffHighlighted = 0;
    }

    if (q->frameGeometry().contains(e->globalPosition().toPoint()))
        return false; //otherwise if the event is in our rect we want it..

    for(QWidget *caused = causedPopup.widget; caused;) {
        bool passOnEvent = false;
        QWidget *next_widget = nullptr;
        QPointF cpos = caused->mapFromGlobal(e->globalPosition());
#if QT_CONFIG(menubar)
        if (QMenuBar *mb = qobject_cast<QMenuBar*>(caused)) {
            passOnEvent = mb->rect().contains(cpos.toPoint());
        } else
#endif
        if (QMenu *m = qobject_cast<QMenu*>(caused)) {
            passOnEvent = m->rect().contains(cpos.toPoint());
            next_widget = m->d_func()->causedPopup.widget;
        }
        if (passOnEvent) {
            if (e->type() != QEvent::MouseButtonRelease || mouseDown == caused) {
                QMouseEvent new_e(e->type(), cpos, caused->mapTo(caused->topLevelWidget(), cpos), e->globalPosition(),
                                  e->button(), e->buttons(), e->modifiers(),
                                  e->source(), e->pointingDevice());
                QCoreApplication::sendEvent(caused, &new_e);
                return true;
            }
        }
        caused = next_widget;
        if (!caused)
            sloppyState.leave(); // Start timers
    }
    return false;
}